

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDescriptor.cpp
# Opt level: O0

void generateDescriptor(Mat *in,vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keyPoint,
                       vector<Descriptor,_std::allocator<Descriptor>_> *keyPointDescriptor)

{
  int in_R8D;
  undefined1 local_d8 [8];
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> keyPointRotation;
  _InputArray local_98;
  Mat local_80 [8];
  Mat grayImg;
  vector<Descriptor,_std::allocator<Descriptor>_> *keyPointDescriptor_local;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keyPoint_local;
  Mat *in_local;
  
  cv::Mat::Mat(local_80);
  cv::_InputArray::_InputArray(&local_98,in);
  cv::_OutputArray::_OutputArray
            ((_OutputArray *)
             &keyPointRotation.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,local_80);
  cv::cvtColor((cv *)&local_98,
               (_InputArray *)
               &keyPointRotation.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(_OutputArray *)0x6,0,in_R8D);
  cv::_OutputArray::~_OutputArray
            ((_OutputArray *)
             &keyPointRotation.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cv::_InputArray::~_InputArray(&local_98);
  std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::vector
            ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_d8);
  kPRotation(local_80,keyPoint,(vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_d8);
  extractDescriptor(local_80,(vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_d8,
                    keyPointDescriptor);
  std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::~vector
            ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_d8);
  cv::Mat::~Mat(local_80);
  return;
}

Assistant:

void generateDescriptor(const Mat& in, const vector<KeyPoint> keyPoint, vector<Descriptor>& keyPointDescriptor) {
	Mat grayImg;
	cvtColor(in, grayImg, COLOR_BGR2GRAY);

	vector<KeyPoint> keyPointRotation;
	kPRotation(grayImg, keyPoint, keyPointRotation);

	//Mat out;
	//drawKeypoints(in, keyPointRotation, out, -1, DrawMatchesFlags::DRAW_RICH_KEYPOINTS);
	//imshow("", out);
	//waitKey();

	extractDescriptor(grayImg, keyPointRotation, keyPointDescriptor);

}